

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
OneWireSimulationDataGenerator::Initialize
          (OneWireSimulationDataGenerator *this,U32 simulation_sample_rate,
          OneWireAnalyzerSettings *settings)

{
  BitState BVar1;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mOneWireSimulationData);
  BVar1 = (BitState)&this->mOneWireSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar1);
  SimulationChannelDescriptor::SetInitialBitState(BVar1);
  this->mSimOverdrive = this->mSettings->mOverdrive;
  return;
}

Assistant:

void OneWireSimulationDataGenerator::Initialize( U32 simulation_sample_rate, OneWireAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mOneWireSimulationData.SetChannel( mSettings->mOneWireChannel );
    mOneWireSimulationData.SetSampleRate( simulation_sample_rate );

    mOneWireSimulationData.SetInitialBitState( BIT_HIGH );
    // mOneWireSimulationData.Advance( 1000 );
    mSimOverdrive = mSettings->mOverdrive;
}